

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long,char8_t>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,unsigned_long value,
          uint prefix,basic_format_specs<char8_t> *specs,digit_grouping<char8_t> *grouping)

{
  byte bVar1;
  long lVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar3;
  byte *pbVar4;
  uint uVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int num_digits;
  char digits [40];
  int local_70;
  uint local_6c;
  anon_class_32_4_dca7119b local_68;
  char local_48 [40];
  
  lVar2 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  local_70 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar2] -
             (uint)(value < *(ulong *)(do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                                      (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar2]
                                      * 8));
  local_6c = prefix;
  format_decimal<char,unsigned_long>(local_48,value,local_70);
  pbVar4 = (byte *)(grouping->sep_).grouping._M_dataplus._M_p;
  pbVar6 = pbVar4 + (grouping->sep_).grouping._M_string_length;
  uVar5 = local_70 - (uint)(local_6c == 0);
  iVar7 = 0;
  do {
    iVar9 = 0x7fffffff;
    if ((grouping->sep_).thousands_sep != '\0') {
      if (pbVar4 == pbVar6) {
        uVar8 = (uint)(char)pbVar6[-1];
      }
      else {
        bVar1 = *pbVar4;
        if ((byte)(bVar1 + 0x81) < 0x82) goto LAB_00113d20;
        pbVar4 = pbVar4 + 1;
        uVar8 = (uint)bVar1;
      }
      iVar7 = iVar7 + uVar8;
      iVar9 = iVar7;
    }
LAB_00113d20:
    uVar5 = uVar5 + 1;
    if (local_70 <= iVar9) {
      if (-1 < (int)uVar5) {
        local_68.prefix = &local_6c;
        local_68.num_digits = &local_70;
        local_68.grouping = grouping;
        local_68.digits = &local_48;
        bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long,char8_t>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::digit_grouping<char8_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_>
                          (out,specs,(ulong)uVar5,(ulong)uVar5,&local_68);
        return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar3.container;
      }
      fmt::v8::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                 ,0x195,"negative value");
    }
  } while( true );
}

Assistant:

auto write_int_localized(OutputIt out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs,
                         const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = count_digits(value);
  char digits[40];
  format_decimal(digits, value, num_digits);
  unsigned size = to_unsigned((prefix != 0 ? 1 : 0) + num_digits +
                              grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        if (prefix != 0) *it++ = static_cast<Char>(prefix);
        return grouping.apply(it, string_view(digits, to_unsigned(num_digits)));
      });
}